

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityCosseratMesh::ComputeStress
          (ChElasticityCosseratMesh *this,ChVector<double> *stress_n,ChVector<double> *stress_m,
          ChVector<double> *strain_n,ChVector<double> *strain_m)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  pointer pCVar14;
  pointer pCVar15;
  ulong uVar16;
  size_type __n;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  shared_ptr<chrono::fea::ChElasticityCosseratMesh::ChSectionMaterial> mmat;
  vector<double,_std::allocator<double>_> sigma_xy;
  vector<double,_std::allocator<double>_> sigma_xx;
  vector<double,_std::allocator<double>_> gamma_xz;
  vector<double,_std::allocator<double>_> gamma_xy;
  vector<double,_std::allocator<double>_> sigma_xz;
  vector<double,_std::allocator<double>_> epsilon_xx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  long local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  ChVector<double> *local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  local_d0 = (long)(this->triangles).
                   super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->triangles).
                   super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  uVar19 = (uint)((ulong)((long)(this->vertexes).
                                super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->vertexes).
                               super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  __n = (size_type)(int)uVar19;
  local_68 = stress_m;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__n,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::vector(&local_80,__n,(allocator_type *)&local_98);
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__n,(allocator_type *)&local_b0);
  std::vector<double,_std::allocator<double>_>::vector(&local_b0,__n,(allocator_type *)&local_c8);
  std::vector<double,_std::allocator<double>_>::vector(&local_c8,__n,(allocator_type *)&local_60);
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__n,(allocator_type *)&local_e8);
  local_d0 = local_d0 >> 2;
  if (0 < (int)uVar19) {
    lVar18 = 8;
    uVar17 = 0;
    do {
      a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar16 = 0;
      if (*(long *)&this->field_0x30 - *(long *)&this->materials != 0x10) {
        uVar16 = uVar17;
      }
      __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            (*(long *)&this->materials + 8 + uVar16 * 0x10);
      local_e8 = __r[-1]._M_pi;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_e0,__r);
      pCVar14 = (this->vertexes).
                super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = strain_m->m_data[1];
      dVar1 = *(double *)((long)pCVar14->m_data + lVar18);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar1;
      dVar2 = *(double *)((long)pCVar14->m_data + lVar18 + -8);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar2;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = strain_n->m_data[0];
      auVar9 = vfmadd213sd_fma(auVar27,auVar24,auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = strain_m->m_data[2];
      auVar9 = vfnmadd231sd_fma(auVar9,auVar22,auVar10);
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar17] = auVar9._0_8_;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = strain_m->m_data[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = strain_n->m_data[1];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = 0.0 - dVar1;
      auVar9 = vfmadd213sd_fma(auVar25,auVar28,auVar20);
      local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar17] = auVar9._0_8_;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = strain_m->m_data[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = strain_n->m_data[2];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar2 + 0.0;
      auVar9 = vfmadd213sd_fma(auVar23,auVar26,auVar21);
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar17] = auVar9._0_8_;
      local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar17] =
           (double)local_e8->_vptr__Sp_counted_base *
           local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar17];
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar17] =
           *(double *)&local_e8->_M_use_count *
           local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar17];
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar17] =
           *(double *)&local_e8->_M_use_count *
           local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar17];
      if (a_Stack_e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_e0[0]._M_pi);
      }
      uVar17 = uVar17 + 1;
      lVar18 = lVar18 + 0x10;
    } while ((uVar19 & 0x7fffffff) != uVar17);
  }
  uVar19 = (int)local_d0 * -0x55555555;
  if (stress_n != (ChVector<double> *)&VNULL) {
    stress_n->m_data[0] = VNULL;
    stress_n->m_data[1] = DAT_00b689a0;
    stress_n->m_data[2] = DAT_00b689a8;
  }
  if (local_68 != (ChVector<double> *)&VNULL) {
    local_68->m_data[0] = VNULL;
    local_68->m_data[1] = DAT_00b689a0;
    local_68->m_data[2] = DAT_00b689a8;
  }
  auVar10 = _DAT_0096bc00;
  auVar9 = _DAT_0096bbf0;
  if (0 < (int)uVar19) {
    auVar38._8_8_ = 0x7fffffffffffffff;
    auVar38._0_8_ = 0x7fffffffffffffff;
    auVar39._8_8_ = 0x4038000000000000;
    auVar39._0_8_ = 0x4038000000000000;
    auVar40._8_8_ = 0x4028000000000000;
    auVar40._0_8_ = 0x4028000000000000;
    pCVar14 = (this->vertexes).
              super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar15 = (this->triangles).
              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar18 = 0;
    do {
      iVar11 = *(int *)((long)pCVar15->m_data + lVar18);
      iVar12 = *(int *)((long)pCVar15->m_data + lVar18 + 8);
      iVar13 = *(int *)((long)pCVar15->m_data + lVar18 + 4);
      lVar18 = lVar18 + 0xc;
      dVar1 = local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar11];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar1;
      dVar2 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar11];
      auVar29._8_8_ = 0;
      auVar29._0_8_ =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar11];
      auVar20 = vmovddup_avx512vl(auVar29);
      dVar3 = local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar12];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar3;
      dVar4 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar12];
      dVar5 = local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar13];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar5;
      auVar48._8_8_ = pCVar14[iVar12].m_data[1];
      auVar48._0_8_ = pCVar14[iVar12].m_data[1];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = pCVar14[iVar11].m_data[1];
      auVar21 = vmovddup_avx512vl(auVar30);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = pCVar14[iVar13].m_data[1];
      auVar22 = vmovddup_avx512vl(auVar31);
      dVar6 = pCVar14[iVar13].m_data[0];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar6;
      dVar7 = pCVar14[iVar11].m_data[0];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar7;
      dVar8 = pCVar14[iVar12].m_data[0];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar8;
      auVar52._8_8_ = 0;
      auVar52._0_8_ =
           local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar13];
      auVar23 = vunpcklpd_avx512vl(auVar43,auVar52);
      auVar53._8_8_ = 0;
      auVar53._0_8_ =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar13];
      auVar24 = vunpcklpd_avx512vl(auVar20,auVar53);
      auVar25 = vunpcklpd_avx512vl(auVar52,auVar43);
      auVar26 = vsubsd_avx512f(auVar48,auVar21);
      auVar27 = vsubsd_avx512f(auVar22,auVar48);
      auVar28 = vunpcklpd_avx512vl(auVar46,auVar47);
      auVar24 = vmulpd_avx512vl(auVar28,auVar24);
      auVar26 = vmulsd_avx512f(auVar45,auVar26);
      auVar26 = vfmadd231sd_avx512f(auVar26,auVar47,auVar27);
      auVar27 = vsubsd_avx512f(auVar21,auVar22);
      auVar26 = vfmadd213sd_avx512f(auVar27,auVar46,auVar26);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = dVar2;
      auVar27 = vunpcklpd_avx512vl(auVar41,auVar49);
      auVar23 = vaddpd_avx512vl(auVar27,auVar23);
      auVar51._8_8_ = 0;
      auVar51._0_8_ =
           local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar12];
      auVar27 = vunpcklpd_avx512vl(auVar44,auVar51);
      auVar28 = vunpcklpd_avx512vl(auVar51,auVar44);
      auVar26 = vmulsd_avx512f(auVar26,ZEXT816(0x3fe0000000000000));
      auVar23 = vaddpd_avx512vl(auVar23,auVar27);
      auVar27 = vunpcklpd_avx512vl(auVar47,auVar45);
      auVar29 = vmulpd_avx512vl(auVar27,auVar20);
      auVar20 = vaddsd_avx512f(auVar20,auVar53);
      auVar54._8_8_ = 0;
      auVar54._0_8_ =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar13];
      auVar55._8_8_ = 0;
      auVar55._0_8_ = dVar4;
      auVar30 = vunpcklpd_avx512vl(auVar55,auVar54);
      auVar26 = vandpd_avx512vl(auVar26,auVar38);
      auVar29 = vdivpd_avx512vl(auVar29,auVar9);
      auVar31 = vmulsd_avx512f(auVar26,ZEXT816(0x3fd5555555555555));
      auVar32 = vmovddup_avx512vl(auVar31);
      auVar23 = vfmadd213pd_avx512vl(auVar32,auVar23,*(undefined1 (*) [16])stress_n->m_data);
      auVar24 = vdivpd_avx512vl(auVar24,auVar39);
      auVar36._0_8_ = auVar29._0_8_ + auVar29._8_8_;
      auVar36._8_8_ = auVar29._0_8_ + auVar29._8_8_;
      *(undefined1 (*) [16])stress_n->m_data = auVar23;
      auVar23 = vshufpd_avx512vl(auVar24,auVar24,1);
      auVar23 = vaddpd_avx512vl(auVar36,auVar23);
      auVar20 = vaddsd_avx512f(auVar20,auVar55);
      auVar26 = vaddsd_avx512f(auVar26,auVar26);
      auVar29 = vunpcklpd_avx512vl(auVar45,auVar46);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = dVar4;
      auVar33 = vunpcklpd_avx512vl(auVar56,auVar49);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar2;
      auVar34 = vunpcklpd_avx512vl(auVar50,auVar41);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = stress_n->m_data[2];
      auVar20 = vfmadd213sd_avx512f(auVar20,auVar31,auVar32);
      auVar23 = vaddpd_avx512vl(auVar24,auVar23);
      auVar24 = vmulpd_avx512vl(auVar27,auVar30);
      auVar27 = vmulpd_avx512vl(auVar29,auVar30);
      auVar24 = vdivpd_avx512vl(auVar24,auVar10);
      auVar27 = vdivpd_avx512vl(auVar27,auVar39);
      vmovsd_avx512f(auVar20);
      stress_n->m_data[2] = stress_n->m_data[2];
      auVar20 = vshufpd_avx512vl(auVar24,auVar24,1);
      auVar29 = vshufpd_avx512vl(auVar27,auVar27,1);
      auVar20 = vaddpd_avx512vl(auVar20,auVar23);
      auVar20 = vaddpd_avx512vl(auVar24,auVar20);
      auVar23 = vunpcklpd_avx512vl(auVar46,auVar21);
      auVar23 = vmulpd_avx512vl(auVar23,auVar33);
      auVar20 = vaddpd_avx512vl(auVar29,auVar20);
      auVar20 = vaddpd_avx512vl(auVar27,auVar20);
      auVar23 = vdivpd_avx512vl(auVar23,auVar40);
      auVar24 = vmulpd_avx512vl(auVar22,auVar34);
      auVar27 = vmulpd_avx512vl(auVar48,auVar34);
      auVar24 = vdivpd_avx512vl(auVar24,auVar39);
      auVar27 = vdivpd_avx512vl(auVar27,auVar39);
      auVar20 = vaddpd_avx512vl(auVar23,auVar20);
      auVar23 = vshufpd_avx512vl(auVar23,auVar23,1);
      auVar20 = vsubpd_avx512vl(auVar20,auVar23);
      auVar23 = vmulsd_avx512f(auVar21,auVar41);
      auVar23 = vdivsd_avx512f(auVar23,ZEXT816(0x4028000000000000));
      auVar20 = vsubpd_avx512vl(auVar20,auVar24);
      auVar23 = vmovddup_avx512vl(auVar23);
      auVar23 = vaddpd_avx512vl(auVar23,auVar24);
      auVar24 = vmulpd_avx512vl(auVar21,auVar25);
      auVar21 = vmulpd_avx512vl(auVar21,auVar28);
      auVar24 = vdivpd_avx512vl(auVar24,auVar39);
      auVar21 = vdivpd_avx512vl(auVar21,auVar39);
      auVar20 = vsubpd_avx512vl(auVar20,auVar24);
      auVar23 = vaddpd_avx512vl(auVar23,auVar24);
      auVar20 = vsubpd_avx512vl(auVar20,auVar27);
      auVar23 = vaddpd_avx512vl(auVar23,auVar27);
      auVar24 = vmulpd_avx512vl(auVar22,auVar25);
      auVar22 = vmulpd_avx512vl(auVar22,auVar28);
      auVar34._0_8_ = auVar20._0_8_;
      auVar34._8_8_ = auVar23._8_8_;
      auVar20 = vdivpd_avx512vl(auVar24,auVar40);
      auVar22 = vdivpd_avx512vl(auVar22,auVar39);
      auVar23 = vsubpd_avx512vl(auVar34,auVar20);
      auVar20 = vaddpd_avx512vl(auVar34,auVar20);
      auVar23 = vsubpd_avx512vl(auVar23,auVar21);
      auVar21 = vaddpd_avx512vl(auVar20,auVar21);
      auVar20 = vmulpd_avx512vl(auVar48,auVar25);
      auVar24 = vmulpd_avx512vl(auVar48,auVar28);
      auVar25 = vmulsd_avx512f(auVar47,auVar41);
      auVar27 = vdivpd_avx512vl(auVar20,auVar39);
      auVar25 = vdivsd_avx512f(auVar25,ZEXT816(0x4028000000000000));
      auVar20 = vdivpd_avx(auVar24,auVar40);
      auVar23 = vsubpd_avx512vl(auVar23,auVar27);
      auVar21 = vaddpd_avx512vl(auVar21,auVar27);
      auVar24 = vmulsd_avx512f(auVar45,auVar41);
      auVar24 = vdivsd_avx512f(auVar24,ZEXT816(0x4038000000000000));
      auVar23 = vsubpd_avx512vl(auVar23,auVar22);
      auVar21 = vaddpd_avx512vl(auVar21,auVar22);
      auVar42._0_8_ = (dVar8 * dVar1) / 24.0;
      auVar42._8_8_ = 0;
      auVar22 = vmovddup_avx512vl(auVar26);
      auVar23 = vsubpd_avx512vl(auVar23,auVar20);
      auVar35._0_8_ = auVar23._0_8_;
      auVar35._8_8_ = auVar20._8_8_ + auVar21._8_8_;
      auVar20 = vfmadd213pd_avx512vl(auVar22,auVar35,*(undefined1 (*) [16])local_68->m_data);
      auVar21 = vaddsd_avx512f(auVar25,auVar24);
      auVar22 = vmulsd_avx512f(auVar47,auVar43);
      auVar22 = vdivsd_avx512f(auVar22,ZEXT816(0x4038000000000000));
      *(undefined1 (*) [16])local_68->m_data = auVar20;
      auVar20 = vaddsd_avx512f(auVar21,auVar22);
      auVar20 = vaddsd_avx512f(auVar42,auVar20);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_68->m_data[2];
      auVar37._8_8_ = 0;
      auVar37._0_8_ =
           (dVar8 * dVar3) / 12.0 +
           (dVar6 * dVar3) / 24.0 +
           (dVar8 * dVar5) / 24.0 + (dVar7 * dVar3) / 24.0 + (dVar6 * dVar5) / 12.0 + auVar20._0_8_;
      auVar20 = vfnmadd213sd_avx512f(auVar37,auVar26,auVar33);
      local_68->m_data[2] = auVar20._0_8_;
    } while ((ulong)(uVar19 & 0x7fffffff) * 0xc != lVar18);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChElasticityCosseratMesh::ComputeStress(ChVector<>& stress_n,
                                             ChVector<>& stress_m,
                                             const ChVector<>& strain_n,
                                             const ChVector<>& strain_m) {
    int nv = (int)this->vertexes.size();
    int nt = (int)this->triangles.size();

    // temp per-vertex data for point strains:
    std::vector<double> epsilon_xx(nv);
    std::vector<double> gamma_xy(nv);
    std::vector<double> gamma_xz(nv);

    // temp per-vertex data for point stresses:
    std::vector<double> sigma_xx(nv);
    std::vector<double> sigma_xy(nv);
    std::vector<double> sigma_xz(nv);

    double warp_dy = 0;  // to do
    double warp_dz = 0;  // to do

    for (int i = 0; i < nv; ++i) {
        std::shared_ptr<ChSectionMaterial> mmat;
        if (materials.size() == 1)
            mmat = materials[0];
        else
            mmat = materials[i];

        double vy = vertexes[i][0];
        double vz = vertexes[i][1];
        epsilon_xx[i] = strain_n.x() + strain_m.y() * vz - strain_m.z() * vy;
        gamma_xy[i] = strain_n.y() + strain_m.x() * (warp_dy - vz);
        gamma_xz[i] = strain_n.z() + strain_m.x() * (warp_dz + vy);
        // simple linear elastic model:
        sigma_xx[i] = mmat->E * epsilon_xx[i];
        sigma_xy[i] = mmat->G * gamma_xy[i];
        sigma_xz[i] = mmat->G * gamma_xz[i];
    }

    // integrate on triangles, assuming linear interpolation of vertex values
    stress_n = VNULL;
    stress_m = VNULL;
    for (int t = 0; t < nt; ++t) {
        size_t iv1 = triangles[t].x();
        size_t iv2 = triangles[t].y();
        size_t iv3 = triangles[t].z();
        double y1 = this->vertexes[iv1][0];
        double z1 = this->vertexes[iv1][1];
        double y2 = this->vertexes[iv2][0];
        double z2 = this->vertexes[iv2][1];
        double y3 = this->vertexes[iv3][0];
        double z3 = this->vertexes[iv3][1];

        double A = fabs(0.5 * ((y1 * (z2 - z3) + y2 * (z3 - z1) + y3 * (z1 - z2))));

        double s1 = sigma_xx[iv1];
        double s2 = sigma_xx[iv2];
        double s3 = sigma_xx[iv3];
        double sxz1 = sigma_xz[iv1];
        double sxz2 = sigma_xz[iv2];
        double sxz3 = sigma_xz[iv3];
        double sxy1 = sigma_xy[iv1];
        double sxy2 = sigma_xy[iv2];
        double sxy3 = sigma_xy[iv3];

        stress_n.x() += (1. / 3.) * A * (s1 + s2 + s3);
        stress_n.y() += (1. / 3.) * A * (sxy1 + sxy2 + sxy3);
        stress_n.z() += (1. / 3.) * A * (sxz1 + sxz2 + sxz3);

        stress_m.x() +=
            2. * A *
            ((sxz1 * y1) / 12. + (sxz1 * y2) / 24. + (sxz2 * y1) / 24. + (sxz1 * y3) / 24. + (sxz2 * y2) / 12. +
             (sxz3 * y1) / 24. + (sxz2 * y3) / 24. + (sxz3 * y2) / 24. + (sxz3 * y3) / 12. - (sxy1 * z1) / 12. -
             (sxy1 * z2) / 24. - (sxy2 * z1) / 24. - (sxy1 * z3) / 24. - (sxy2 * z2) / 12. - (sxy3 * z1) / 24. -
             (sxy2 * z3) / 24. - (sxy3 * z2) / 24. - (sxy3 * z3) / 12.);
        stress_m.y() += 2. * A *
                        ((s1 * z1) / 12. + (s1 * z2) / 24. + (s2 * z1) / 24. + (s1 * z3) / 24. + (s2 * z2) / 12. +
                         (s3 * z1) / 24. + (s2 * z3) / 24. + (s3 * z2) / 24. + (s3 * z3) / 12.);
        stress_m.z() -= 2. * A *
                        ((s1 * y1) / 12. + (s1 * y2) / 24. + (s2 * y1) / 24. + (s1 * y3) / 24. + (s2 * y2) / 12. +
                         (s3 * y1) / 24. + (s2 * y3) / 24. + (s3 * y2) / 24. + (s3 * y3) / 12.);
    }
}